

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O0

uint32_t woff2::anon_unknown_3::ComputeHeaderChecksum(Font *font)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  reference ppVar4;
  short local_50;
  short local_4c;
  Table *local_48;
  Table *table;
  pair<const_unsigned_int,_woff2::Font::Table> *i;
  const_iterator __end2;
  const_iterator __begin2;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range2;
  uint32_t uStack_14;
  uint16_t range_shift;
  uint16_t search_range;
  uint16_t max_pow2;
  uint32_t checksum;
  Font *font_local;
  
  uVar1 = font->flavor;
  if (font->num_tables == 0) {
    local_4c = 0;
  }
  else {
    iVar3 = Log2Floor((uint)font->num_tables);
    local_4c = (short)iVar3;
  }
  if (local_4c == 0) {
    local_50 = 0;
  }
  else {
    local_50 = (short)(1 << ((char)local_4c + 4U & 0x1f));
  }
  uStack_14 = CONCAT22(local_4c,font->num_tables * 0x10 - local_50) +
              CONCAT22(font->num_tables,local_50) + uVar1;
  __end2 = std::
           map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
           ::begin(&font->tables);
  i = (pair<const_unsigned_int,_woff2::Font::Table> *)
      std::
      map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
      ::end(&font->tables);
  while (bVar2 = std::operator!=(&__end2,(_Self *)&i), bVar2) {
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
             operator*(&__end2);
    local_48 = &ppVar4->second;
    bVar2 = Font::Table::IsReused(local_48);
    if (bVar2) {
      local_48 = (ppVar4->second).reuse_of;
    }
    uStack_14 = local_48->length + local_48->offset + local_48->checksum + local_48->tag + uStack_14
    ;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator++
              (&__end2);
  }
  return uStack_14;
}

Assistant:

uint32_t ComputeHeaderChecksum(const Font& font) {
  uint32_t checksum = font.flavor;
  uint16_t max_pow2 = font.num_tables ? Log2Floor(font.num_tables) : 0;
  uint16_t search_range = max_pow2 ? 1 << (max_pow2 + 4) : 0;
  uint16_t range_shift = (font.num_tables << 4) - search_range;
  checksum += (font.num_tables << 16 | search_range);
  checksum += (max_pow2 << 16 | range_shift);
  for (const auto& i : font.tables) {
    const Font::Table* table = &i.second;
    if (table->IsReused()) {
      table = table->reuse_of;
    }
    checksum += table->tag;
    checksum += table->checksum;
    checksum += table->offset;
    checksum += table->length;
  }
  return checksum;
}